

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O0

void __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::set
          (Parameter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimension)

{
  bool bVar1;
  size_type sVar2;
  range_error *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  ulong uVar4;
  const_iterator in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionWithStrLen;
  uint i;
  size_t first_dim;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionCopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  Parameter *this_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  Parameter *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 local_54;
  ulong local_50;
  value_type_conflict3 *in_stack_ffffffffffffffd8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffe0;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x167619);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX._M_current);
  if (sVar2 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(in_RSI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff50,(value_type_conflict3 *)in_stack_ffffffffffffff48);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX._M_current);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RSI);
  bVar1 = isDimensionConsistent
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error
              (this_00,"Dimension of the data does not correspond to sent dimensions");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  local_50 = 0;
  local_54 = 0;
  while( true ) {
    this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(ulong)(uint)local_54;
    pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(in_RSI);
    if (pvVar3 <= this_01) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RSI,(ulong)(uint)local_54);
    uVar4 = std::__cxx11::string::size();
    if (local_50 < uVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RSI,(ulong)(uint)local_54);
      local_50 = std::__cxx11::string::size();
    }
    local_54 = local_54 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  this_02 = (Parameter *)&stack0xffffffffffffff90;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)this_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_ffffffffffffff48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
            (in_stack_ffffffffffffffe0,in_RDX,in_stack_ffffffffffffffd8);
  *(undefined4 *)(in_RDI + 0x44) = 0xffffffff;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDX._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX._M_current);
  setEmptyFlag(this_02);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_01);
  return;
}

Assistant:

void ezc3d::ParametersNS::GroupNS::Parameter::set(
    const std::vector<std::string> &data,
    const std::vector<size_t> &dimension) {
  std::vector<size_t> dimensionCopy;
  if (dimension.size() == 0) {
    dimensionCopy.push_back(data.size());
  } else {
    dimensionCopy = dimension;
  }
  if (!isDimensionConsistent(data.size(), dimensionCopy))
    throw std::range_error(
        "Dimension of the data does not correspond to sent dimensions");
  // Insert the length of the longest string
  size_t first_dim(0);
  for (unsigned int i = 0; i < data.size(); ++i)
    if (data[i].size() > first_dim)
      first_dim = data[i].size();
  std::vector<size_t> dimensionWithStrLen = dimensionCopy;
  dimensionWithStrLen.insert(dimensionWithStrLen.begin(), first_dim);

  _data_type = ezc3d::DATA_TYPE::CHAR;
  _param_data_string = data;
  _dimension = dimensionWithStrLen;
  setEmptyFlag();
}